

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode auth_basic(Curl_easy *data,auth *authp,unsigned_long *availp)

{
  unsigned_long *availp_local;
  auth *authp_local;
  Curl_easy *data_local;
  
  *availp = *availp | 1;
  authp->avail = authp->avail | 1;
  if (authp->picked == 1) {
    authp->avail = 0;
    if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x894 >> 0x1e & 1) != 0)) &&
       (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
      Curl_infof(data,"Basic authentication problem, ignoring.");
    }
    *(uint *)&(data->state).field_0x7be = *(uint *)&(data->state).field_0x7be & 0xffffff7f | 0x80;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode auth_basic(struct Curl_easy *data,
                           struct auth *authp,
                           unsigned long *availp)
{
  *availp |= CURLAUTH_BASIC;
  authp->avail |= CURLAUTH_BASIC;
  if(authp->picked == CURLAUTH_BASIC) {
    /* We asked for Basic authentication but got a 40X back
       anyway, which basically means our name+password is not
       valid. */
    authp->avail = CURLAUTH_NONE;
    infof(data, "Basic authentication problem, ignoring.");
    data->state.authproblem = TRUE;
  }
  return CURLE_OK;
}